

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mon-init.c
# Opt level: O2

parser_error parse_monster_friends_base(parser *p)

{
  undefined4 uVar1;
  _Bool _Var2;
  uint uVar3;
  int iVar4;
  parser_error pVar5;
  void *pvVar6;
  undefined8 *p_00;
  char *pcVar7;
  monster_base *pmVar8;
  random_conflict rVar9;
  
  pvVar6 = parser_priv(p);
  if (pvVar6 == (void *)0x0) {
    pVar5 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    p_00 = (undefined8 *)mem_zalloc(0x20);
    rVar9 = parser_getrand(p,"number");
    *(wchar_t *)(p_00 + 3) = rVar9.dice;
    *(wchar_t *)((long)p_00 + 0x1c) = rVar9.sides;
    uVar3 = parser_getuint(p,"chance");
    *(uint *)((long)p_00 + 0x14) = uVar3;
    pcVar7 = parser_getsym(p,"name");
    pmVar8 = lookup_monster_base(pcVar7);
    p_00[1] = pmVar8;
    if (pmVar8 == (monster_base *)0x0) {
      mem_free(p_00);
      pVar5 = PARSE_ERROR_INVALID_MONSTER_BASE;
    }
    else {
      _Var2 = parser_hasval(p,"role");
      if (_Var2) {
        pcVar7 = parser_getsym(p,"role");
        iVar4 = strcmp(pcVar7,"servant");
        if (iVar4 == 0) {
          uVar1 = 1;
        }
        else {
          iVar4 = strcmp(pcVar7,"bodyguard");
          if (iVar4 != 0) {
            mem_free(p_00);
            return PARSE_ERROR_INVALID_MONSTER_ROLE;
          }
          uVar1 = 2;
        }
      }
      else {
        uVar1 = 3;
      }
      *(undefined4 *)(p_00 + 2) = uVar1;
      *p_00 = *(undefined8 *)((long)pvVar6 + 0xb0);
      *(undefined8 **)((long)pvVar6 + 0xb0) = p_00;
      pVar5 = PARSE_ERROR_NONE;
    }
  }
  return pVar5;
}

Assistant:

static enum parser_error parse_monster_friends_base(struct parser *p) {
	struct monster_race *r = parser_priv(p);
	struct monster_friends_base *f;
	struct random number;

	if (!r)
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	f = mem_zalloc(sizeof *f);
	number = parser_getrand(p, "number");
	f->number_dice = number.dice;
	f->number_side = number.sides;
	f->percent_chance = parser_getuint(p, "chance");
	f->base = lookup_monster_base(parser_getsym(p, "name"));
	if (!f->base) {
		mem_free(f);
		return PARSE_ERROR_INVALID_MONSTER_BASE;
	}
	if (parser_hasval(p, "role")) {
		const char *role_name = parser_getsym(p, "role");
		if (streq(role_name, "servant")) {
			f->role = MON_GROUP_SERVANT;
		} else if (streq(role_name, "bodyguard")) {
			f->role = MON_GROUP_BODYGUARD;
		} else {
			mem_free(f);
			return PARSE_ERROR_INVALID_MONSTER_ROLE;
		}
	} else {
		f->role = MON_GROUP_MEMBER;
	}

	f->next = r->friends_base;
	r->friends_base = f;

	return PARSE_ERROR_NONE;
}